

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compiler.c++
# Opt level: O0

Maybe<unsigned_long> __thiscall
capnp::compiler::Compiler::lookup(Compiler *this,uint64_t parent,StringPtr childName)

{
  Own<capnp::compiler::Compiler::Impl,_std::nullptr_t> *this_00;
  Impl *parent_00;
  anon_union_8_1_a8c68091_for_NullableValue<unsigned_long>_2 extraout_RDX;
  Maybe<unsigned_long> MVar1;
  StringPtr childName_00;
  Maybe<kj::_::Mutex::Waiter_&> *local_30;
  uint64_t parent_local;
  Compiler *this_local;
  StringPtr childName_local;
  
  this_local = (Compiler *)childName.content.size_;
  local_30 = (Maybe<kj::_::Mutex::Waiter_&> *)childName.content.ptr;
  parent_local = parent;
  childName_local.content.size_ = (size_t)this;
  kj::MutexGuarded<kj::Own<capnp::compiler::Compiler::Impl,_std::nullptr_t>_>::lockExclusive
            ((MutexGuarded<kj::Own<capnp::compiler::Compiler::Impl,_std::nullptr_t>_> *)
             &stack0xffffffffffffffc0,parent + 8);
  this_00 = kj::Locked<kj::Own<capnp::compiler::Compiler::Impl,_std::nullptr_t>_>::operator->
                      ((Locked<kj::Own<capnp::compiler::Compiler::Impl,_std::nullptr_t>_> *)
                       &stack0xffffffffffffffc0);
  parent_00 = kj::Own<capnp::compiler::Compiler::Impl,_std::nullptr_t>::get(this_00);
  childName_00.content.size_ = (size_t)this_local;
  childName_00.content.ptr = (char *)local_30;
  Impl::lookup((Impl *)this,(uint64_t)parent_00,childName_00);
  kj::Locked<kj::Own<capnp::compiler::Compiler::Impl,_std::nullptr_t>_>::~Locked
            ((Locked<kj::Own<capnp::compiler::Compiler::Impl,_std::nullptr_t>_> *)
             &stack0xffffffffffffffc0);
  MVar1.ptr.field_1.value = extraout_RDX.value;
  MVar1.ptr._0_8_ = this;
  return (Maybe<unsigned_long>)MVar1.ptr;
}

Assistant:

kj::Maybe<uint64_t> Compiler::lookup(uint64_t parent, kj::StringPtr childName) const {
  return impl.lockExclusive()->get()->lookup(parent, childName);
}